

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O2

void __thiscall
FluidSynthMIDIDevice::HandleEvent(FluidSynthMIDIDevice *this,int status,int parm1,int parm2)

{
  uint uVar1;
  _func_int_fluid_synth_t_ptr_int_int *UNRECOVERED_JUMPTABLE_00;
  _func_int_fluid_synth_t_ptr_int_int_int *UNRECOVERED_JUMPTABLE;
  TReqProc<FluidSynthModule,_int_(*)(fluid_synth_t_*,_int,_int,_int)> *this_00;
  TReqProc<FluidSynthModule,_int_(*)(fluid_synth_t_*,_int,_int)> *this_01;
  fluid_synth_t *pfVar2;
  
  uVar1 = (status & 0xf0U) - 0x80 >> 4;
  if (6 < uVar1) {
switchD_0035dc3e_caseD_2:
    return;
  }
  switch(uVar1) {
  case 0:
    this_01 = &fluid_synth_noteoff;
    break;
  case 1:
    this_00 = &fluid_synth_noteon;
    goto LAB_0035dc89;
  case 2:
    goto switchD_0035dc3e_caseD_2;
  case 3:
    this_00 = &fluid_synth_cc;
LAB_0035dc89:
    UNRECOVERED_JUMPTABLE = TReqProc::operator_cast_to_function_pointer((TReqProc *)this_00);
    (*UNRECOVERED_JUMPTABLE)(this->FluidSynth,status & 0xfU,parm1,parm2);
    return;
  case 4:
    this_01 = &fluid_synth_program_change;
    break;
  case 5:
    this_01 = &fluid_synth_channel_pressure;
    break;
  case 6:
    UNRECOVERED_JUMPTABLE_00 =
         TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_pitch_bend);
    pfVar2 = this->FluidSynth;
    parm1 = (parm2 & 0x7fU) << 7 | parm1 & 0x7fU;
    goto LAB_0035dcc2;
  }
  UNRECOVERED_JUMPTABLE_00 = TReqProc::operator_cast_to_function_pointer((TReqProc *)this_01);
  pfVar2 = this->FluidSynth;
LAB_0035dcc2:
  (*UNRECOVERED_JUMPTABLE_00)(pfVar2,status & 0xfU,parm1);
  return;
}

Assistant:

void FluidSynthMIDIDevice::HandleEvent(int status, int parm1, int parm2)
{
	int command = status & 0xF0;
	int channel = status & 0x0F;
	
	switch (command)
	{
	case MIDI_NOTEOFF:
		fluid_synth_noteoff(FluidSynth, channel, parm1);
		break;

	case MIDI_NOTEON:
		fluid_synth_noteon(FluidSynth, channel, parm1, parm2);
		break;

	case MIDI_POLYPRESS:
		break;

	case MIDI_CTRLCHANGE:
		fluid_synth_cc(FluidSynth, channel, parm1, parm2);
		break;

	case MIDI_PRGMCHANGE:
		fluid_synth_program_change(FluidSynth, channel, parm1);
		break;

	case MIDI_CHANPRESS:
		fluid_synth_channel_pressure(FluidSynth, channel, parm1);
		break;

	case MIDI_PITCHBEND:
		fluid_synth_pitch_bend(FluidSynth, channel, (parm1 & 0x7f) | ((parm2 & 0x7f) << 7));
		break;
	}
}